

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O2

int nh_http_parse(http_context_t *ctx)

{
  nh_stream_t *stream;
  char cVar1;
  uint uVar2;
  char *pcVar3;
  nh_http_version nVar4;
  uint32_t uVar5;
  int iVar6;
  
  stream = &ctx->raw;
switchD_00105d98_default:
  uVar2 = (ctx->raw).index;
  if ((ctx->raw).length <= uVar2) {
    return 1;
  }
  switch(ctx->parse_state) {
  case PARSE_METHOD:
    uVar5 = nh_stream_find_next(stream,' ',0x10);
    if ((int)uVar5 < 1) {
      return 0;
    }
    (ctx->method).index = uVar2;
    (ctx->method).len = uVar5;
    ctx->parse_state = PARSE_PATH;
    goto LAB_00105e57;
  case PARSE_PATH:
    uVar5 = nh_stream_find_next(stream,' ',0x800);
    if ((int)uVar5 < 1) {
      return 0;
    }
    (ctx->path).index = uVar2;
    (ctx->path).len = uVar5;
    ctx->parse_state = PARSE_VERSION;
LAB_00105e57:
    (ctx->raw).index = uVar5 + uVar2 + 1;
    goto switchD_00105d98_default;
  case PARSE_VERSION:
    pcVar3 = stream->buf;
    iVar6 = nh_string_cmp("HTTP/1.",pcVar3 + uVar2,7);
    if (iVar6 != 0) {
      (ctx->raw).index = uVar2 + 7;
      cVar1 = pcVar3[uVar2 + 7];
      nVar4 = HTTP_1_0;
      if (cVar1 != '0') {
        if (cVar1 != '1') {
          return 0;
        }
        nVar4 = HTTP_1_1;
      }
      ctx->version = nVar4;
      ctx->parse_state = PARSE_LINE_END;
      (ctx->raw).index = uVar2 + 8;
      goto switchD_00105d98_default;
    }
    break;
  case PARSE_HEADER:
    iVar6 = nh_http_parse_consume_header(ctx);
    if (iVar6 != 0) {
      ctx->parse_state = PARSE_LINE_END;
      goto switchD_00105d98_default;
    }
    break;
  case PARSE_SECOND_LINE_END:
    iVar6 = nh_string_cmp("\r\n",stream->buf + uVar2,2);
    if (iVar6 != 0) {
      (ctx->raw).index = uVar2 + 2;
      ctx->parse_state = PARSE_BODY;
      nh_http_parse_get_body_len(ctx);
      goto switchD_00105d98_caseD_5;
    }
    ctx->parse_state = PARSE_HEADER;
    goto switchD_00105d98_default;
  case PARSE_BODY:
switchD_00105d98_caseD_5:
    iVar6 = nh_http_parse_consume_body(ctx);
    if (iVar6 != 0) {
      ctx->parse_state = PARSE_DONE;
    }
    goto switchD_00105d98_default;
  case PARSE_LINE_END:
    iVar6 = nh_string_cmp("\r\n",stream->buf + uVar2,2);
    if (iVar6 != 0) {
      (ctx->raw).index = uVar2 + 2;
      ctx->parse_state = PARSE_SECOND_LINE_END;
      goto switchD_00105d98_default;
    }
    break;
  case PARSE_DONE:
    goto LAB_00105f17;
  default:
    goto switchD_00105d98_default;
  }
  return 0;
LAB_00105f17:
  return 1;
}

Assistant:

int nh_http_parse(http_context_t *ctx) {
    //         Request       = Request-Line
    //                        *(( general-header
    //                         | request-header
    //                         | entity-header ) CRLF)
    //                        CRLF
    //                        [ message-body ]
    //
    // Request-Line   = Method SP Request-URI SP HTTP-Version CRLF
    nh_stream_t *stream = &ctx->raw;
    int offset;
    while (stream->index < stream->length) {
        switch (ctx->parse_state) {
            case PARSE_METHOD:
                if ((offset = nh_stream_find_next(stream, ' ', 16)) <= 0) return 0;
                ctx->method = (nh_anchor_t) {.index = stream->index, .len = offset};
                ctx->parse_state = PARSE_PATH;
                stream->index += offset + 1;
                break;
            case PARSE_PATH:
                if ((offset = nh_stream_find_next(stream, ' ', 2048)) <= 0) return 0;
                ctx->path = (nh_anchor_t) {.index = stream->index, .len = offset};
                ctx->parse_state = PARSE_VERSION;
                stream->index += offset + 1;
                break;
            case PARSE_VERSION:
                if (!nh_string_cmp("HTTP/1.", &stream->buf[stream->index], 7)) return 0;
                stream->index += 7;
                switch (stream->buf[stream->index]) {
                    case '0':
                        ctx->version = HTTP_1_0;
                        break;
                    case '1':
                        ctx->version = HTTP_1_1;
                        break;
                    default:
                        return 0;
                }
                ctx->parse_state = PARSE_LINE_END;
                stream->index += 1;
                break;
            case PARSE_LINE_END:
                if (!nh_string_cmp("\r\n", &stream->buf[stream->index], 2)) return 0;
                stream->index += 2;
                ctx->parse_state = PARSE_SECOND_LINE_END;
                break;
            case PARSE_SECOND_LINE_END:
                if (!nh_string_cmp("\r\n", &stream->buf[stream->index], 2)) {
                    ctx->parse_state = PARSE_HEADER;
                    break;
                }
                // parse body
                stream->index += 2;
                ctx->parse_state = PARSE_BODY;
                // get body length before consume body
                nh_http_parse_get_body_len(ctx);
                // fallthrough
            case PARSE_BODY:
                if (nh_http_parse_consume_body(ctx)) ctx->parse_state = PARSE_DONE;
                break;
            case PARSE_HEADER:
                if (!nh_http_parse_consume_header(ctx)) return 0;
                ctx->parse_state = PARSE_LINE_END;
                break;
            case PARSE_DONE:
                return 1;
        }
    }
    return 1;
}